

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

size_t __thiscall
helics::ActionMessage::fromByteArray(ActionMessage *this,byte *data,size_t buffer_size)

{
  string_view data_00;
  int iVar1;
  size_t sVar2;
  long lVar3;
  BaseType *pBVar4;
  BaseType *pBVar5;
  char *pcVar6;
  baseType bVar7;
  ulong in_RDX;
  uint8_t *in_RSI;
  int *in_RDI;
  bool bVar8;
  baseType timecode;
  uint32_t ssize;
  size_t ii;
  unsigned_long stringCount;
  baseType btc;
  bool swap;
  size_t size;
  size_t res;
  size_t tsize;
  undefined7 in_stack_ffffffffffffff60;
  uint8_t in_stack_ffffffffffffff67;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 in_stack_ffffffffffffff70 [16];
  SmallBuffer *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  ActionMessage *in_stack_ffffffffffffffa0;
  ulong local_30;
  uint *local_20;
  ulong local_10;
  
  if ((fromByteArray(std::byte_const*,unsigned_long)::littleEndian == '\0') &&
     (iVar1 = __cxa_guard_acquire(&fromByteArray(std::byte_const*,unsigned_long)::littleEndian),
     iVar1 != 0)) {
    fromByteArray::littleEndian = isLittleEndian();
    in_stack_ffffffffffffff67 = fromByteArray::littleEndian;
    __cxa_guard_release(&fromByteArray(std::byte_const*,unsigned_long)::littleEndian);
  }
  if (in_RDX < 0x2d) {
    *in_RDI = 0xf69b5;
    local_10 = 0;
  }
  else if ((*in_RSI == 0xf3) &&
          (sVar2 = depacketize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                               (size_t)in_stack_ffffffffffffff90), sVar2 != 0)) {
    local_10 = (ulong)(int)sVar2;
  }
  else if (*in_RSI == '{') {
    local_10 = 0;
  }
  else {
    lVar3 = (ulong)in_RSI[1] * 0x10000 + (ulong)in_RSI[2] * 0x100 + (ulong)in_RSI[3];
    local_30 = lVar3 + 0x2d;
    if (in_RDX < local_30) {
      *in_RDI = 0xf69b5;
      local_10 = 0;
    }
    else {
      bVar8 = *in_RSI != fromByteArray::littleEndian;
      *in_RDI = *(int *)(in_RSI + 4);
      if (bVar8) {
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      }
      in_RDI[1] = *(int *)(in_RSI + 8);
      pBVar4 = GlobalFederateId::getBaseTypePointer((GlobalFederateId *)(in_RDI + 2));
      *pBVar4 = *(BaseType *)(in_RSI + 0xc);
      pBVar5 = InterfaceHandle::getBaseTypePointer((InterfaceHandle *)(in_RDI + 3));
      *pBVar5 = *(BaseType *)(in_RSI + 0x10);
      pBVar4 = GlobalFederateId::getBaseTypePointer((GlobalFederateId *)(in_RDI + 4));
      *pBVar4 = *(BaseType *)(in_RSI + 0x14);
      pBVar5 = InterfaceHandle::getBaseTypePointer((InterfaceHandle *)(in_RDI + 5));
      *pBVar5 = *(BaseType *)(in_RSI + 0x18);
      *(undefined2 *)(in_RDI + 6) = *(undefined2 *)(in_RSI + 0x1c);
      *(undefined2 *)((long)in_RDI + 0x1a) = *(undefined2 *)(in_RSI + 0x1e);
      in_RDI[7] = *(int *)(in_RSI + 0x20);
      TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8),
                 *(baseType *)(in_RSI + 0x24));
      local_20 = (uint *)(in_RSI + 0x2c);
      if (*in_RDI == 500) {
        local_30 = lVar3 + 0x45;
        if (in_RDX < local_30) {
          *in_RDI = 0xf69b5;
          return 0;
        }
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                  ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10),*(baseType *)local_20);
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                  ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc),
                   *(baseType *)(in_RSI + 0x34));
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                  ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xe),
                   *(baseType *)(in_RSI + 0x3c));
        local_20 = (uint *)(in_RSI + 0x44);
      }
      else {
        in_RDI[10] = 0;
        in_RDI[0xb] = 0;
        in_RDI[0xc] = 0;
        in_RDI[0xd] = 0;
        in_RDI[0xe] = 0;
        in_RDI[0xf] = 0;
      }
      if (lVar3 != 0) {
        SmallBuffer::assign(in_stack_ffffffffffffff70._0_8_,in_RDI,
                            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        local_20 = (uint *)((long)local_20 + lVar3);
      }
      this_00 = in_stack_ffffffffffffff70._0_8_;
      pcVar6 = (char *)(ulong)(byte)*local_20;
      local_20 = (uint *)((long)local_20 + 1);
      if (pcVar6 == (char *)0x0) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x5cb3e9);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff70._8_8_);
        local_30 = (long)pcVar6 * 4 + local_30;
        if (in_RDX < local_30) {
          *in_RDI = 0xf69b5;
          return 0;
        }
        for (in_stack_ffffffffffffff90 = (char *)0x0; this_00 = in_stack_ffffffffffffff70._0_8_,
            in_stack_ffffffffffffff90 < pcVar6;
            in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
          in_stack_ffffffffffffff8c = *local_20;
          if (bVar8) {
            swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                           );
          }
          local_30 = in_stack_ffffffffffffff8c + local_30;
          if (in_RDX < local_30) {
            *in_RDI = 0xf69b5;
            return 0;
          }
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x28),(size_type)in_stack_ffffffffffffff90);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          assign(in_stack_ffffffffffffff70._0_8_,(char *)in_RDI,
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
          local_20 = (uint *)((long)local_20 + (ulong)in_stack_ffffffffffffff8c + 4);
        }
      }
      if (bVar8) {
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<4ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<2ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        swap_bytes<2ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        in_stack_ffffffffffffff80 =
             (SmallBuffer *)
             TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                       ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8));
        swap_bytes<8ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                  ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8),
                   (baseType)in_stack_ffffffffffffff80);
        if (*in_RDI == 500) {
          bVar7 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                            ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10));
          swap_bytes<8ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
          TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 10),bVar7);
          bVar7 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                            ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc));
          swap_bytes<8ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
          TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xc),bVar7);
          in_stack_ffffffffffffff80 =
               (SmallBuffer *)
               TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xe));
          swap_bytes<8ul>((uint8_t *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
          TimeRepresentation<count_time<9,_long>_>::setBaseTimeCode
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0xe),
                     (baseType)in_stack_ffffffffffffff80);
        }
      }
      if ((lVar3 == 0xffffff) &&
         (bVar8 = CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(this_00), !bVar8)) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        data_00._M_len._4_4_ = in_stack_ffffffffffffff8c;
        data_00._M_len._0_4_ = in_stack_ffffffffffffff88;
        data_00._M_str = in_stack_ffffffffffffff90;
        SmallBuffer::append(in_stack_ffffffffffffff80,data_00);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x5cb59b);
      }
      local_10 = local_30;
    }
  }
  return local_10;
}

Assistant:

std::size_t ActionMessage::fromByteArray(const std::byte* data, std::size_t buffer_size)
{
    std::size_t tsize{action_message_base_size};
    static const uint8_t littleEndian = isLittleEndian();
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    if (data[0] == static_cast<std::byte>(LEADING_CHAR)) {
        auto res = depacketize(data, buffer_size);
        if (res > 0) {
            return static_cast<int>(res);
        }
    }
    // this means it probably is a JSON packate
    if (data[0] == std::byte{'{'}) {
        return 0;
    }
    const std::size_t size = 256ULL * 256ULL * (std::to_integer<std::size_t>(data[1])) +
        256ULL * std::to_integer<std::size_t>(data[2]) + std::to_integer<std::size_t>(data[3]);
    tsize += size;
    if (buffer_size < tsize) {
        messageAction = CMD_INVALID;
        return (0);
    }
    const bool swap = (data[0] != static_cast<std::byte>(littleEndian));
    data += sizeof(uint32_t);
    memcpy(&messageAction, data, sizeof(action_message_def::action_t));
    // messageAction = *reinterpret_cast<const action_message_def::action_t *> (data);
    if (swap) {
        swap_bytes<sizeof(action_message_def::action_t)>(
            reinterpret_cast<std::uint8_t*>(&messageAction));
    }
    data += sizeof(action_message_def::action_t);
    // messageID = *reinterpret_cast<const int32_t *> (data);
    memcpy(&messageID, data, sizeof(int32_t));
    data += sizeof(int32_t);
    // source_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // source_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(source_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // dest_id = GlobalFederateId{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_id.getBaseTypePointer(), data, sizeof(GlobalFederateId::BaseType));
    data += sizeof(GlobalFederateId);
    // dest_handle = InterfaceHandle{*reinterpret_cast<const int32_t *> (data)};
    memcpy(dest_handle.getBaseTypePointer(), data, sizeof(InterfaceHandle::BaseType));
    data += sizeof(InterfaceHandle);
    // counter = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&counter, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // flags = *reinterpret_cast<const uint16_t *> (data);
    memcpy(&flags, data, sizeof(uint16_t));
    data += sizeof(uint16_t);
    // sequenceID = *reinterpret_cast<const uint32_t *> (data);
    memcpy(&sequenceID, data, sizeof(uint32_t));
    data += sizeof(uint32_t);
    Time::baseType btc;
    memcpy(&btc, data, sizeof(Time::baseType));
    actionTime.setBaseTimeCode(btc);
    data += sizeof(Time::baseType);

    if (messageAction == CMD_TIME_REQUEST) {
        tsize += 3 * sizeof(Time::baseType);
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }
        memcpy(&btc, data, sizeof(Time::baseType));
        Te.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tdemin.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
        memcpy(&btc, data, sizeof(Time::baseType));
        Tso.setBaseTimeCode(btc);
        data += sizeof(Time::baseType);
    } else {
        Te = timeZero;
        Tdemin = timeZero;
        Tso = timeZero;
    }
    if (size > 0) {
        payload.assign(data, size);
        data += size;
    }
    auto stringCount = std::to_integer<std::size_t>(*data);
    ++data;
    if (stringCount != 0) {
        stringData.resize(stringCount);
        tsize += 4 * stringCount;
        if (buffer_size < tsize) {
            messageAction = CMD_INVALID;
            return (0);
        }

        for (std::size_t ii = 0; ii < stringCount; ++ii) {
            uint32_t ssize;
            memcpy(&ssize, data, sizeof(uint32_t));
            data += sizeof(uint32_t);
            if (swap) {
                swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&ssize));
            }
            tsize += ssize;
            if (buffer_size < tsize) {
                messageAction = CMD_INVALID;
                return (0);
            }
            stringData[ii].assign(reinterpret_cast<const char*>(data), ssize);
            data += ssize;
        }
    } else {
        stringData.clear();
    }

    if (swap) {
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&messageID));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&source_handle));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_id));
        swap_bytes<4>(reinterpret_cast<std::uint8_t*>(&dest_handle));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&counter));
        swap_bytes<2>(reinterpret_cast<std::uint8_t*>(&flags));
        auto timecode = actionTime.getBaseTimeCode();
        swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
        actionTime.setBaseTimeCode(timecode);
        if (messageAction == CMD_TIME_REQUEST) {
            timecode = Te.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Te.setBaseTimeCode(timecode);
            timecode = Tdemin.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tdemin.setBaseTimeCode(timecode);
            timecode = Tso.getBaseTimeCode();
            swap_bytes<sizeof(Time::baseType)>(reinterpret_cast<std::uint8_t*>(&timecode));
            Tso.setBaseTimeCode(timecode);
        }
    }
    if (size == maxPayloadSize && !stringData.empty()) {
        payload.append(stringData.back());
        stringData.pop_back();
    }
    return tsize;
}